

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O3

void __thiscall
embree::ParallelRadixSort<embree::avx::PresplitItem,_unsigned_int>::tbbRadixIteration1
          (ParallelRadixSort<embree::avx::PresplitItem,_unsigned_int> *this,uint shift,
          PresplitItem *src,PresplitItem *dst,size_t threadIndex,size_t threadCount)

{
  size_t sVar1;
  PresplitItem PVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  size_t i;
  ulong uVar5;
  TyRadixCount *pauVar6;
  uint uVar7;
  TyRadixCount *pauVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  uint offset [256];
  uint total [256];
  uint local_880 [8];
  undefined1 auStack_860 [16];
  undefined1 auStack_850 [972];
  int aiStack_484 [9];
  undefined1 auStack_460 [16];
  undefined1 auStack_450 [1056];
  
  sVar1 = this->N;
  lVar11 = 0;
  memset(aiStack_484 + 1,0,0x400);
  uVar5 = (sVar1 * threadIndex) / threadCount;
  pauVar6 = this->radixCount;
  pauVar8 = pauVar6;
  do {
    uVar10 = 0xfffffffffffffff8;
    do {
      auVar3 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar8 + uVar10 + 0xc),
                          *(undefined1 (*) [16])(auStack_450 + uVar10 * 4));
      auVar4 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar8 + uVar10 + 8),
                          *(undefined1 (*) [16])(auStack_460 + uVar10 * 4));
      *(undefined1 (*) [16])(auStack_460 + uVar10 * 4) = auVar4;
      *(undefined1 (*) [16])(auStack_450 + uVar10 * 4) = auVar3;
      uVar10 = uVar10 + 8;
    } while (uVar10 < 0xf8);
    lVar11 = lVar11 + 1;
    pauVar8 = pauVar8 + 1;
  } while (lVar11 != threadCount + (threadCount == 0));
  local_880[0] = 0;
  lVar11 = 1;
  uVar7 = 0;
  do {
    uVar7 = uVar7 + aiStack_484[lVar11];
    local_880[lVar11] = uVar7;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x100);
  if (threadIndex != 0) {
    sVar9 = 0;
    do {
      uVar10 = 0xfffffffffffffff8;
      do {
        auVar3 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar6 + uVar10 + 0xc),
                            *(undefined1 (*) [16])(auStack_850 + uVar10 * 4));
        auVar4 = vpaddd_avx(*(undefined1 (*) [16])(*pauVar6 + uVar10 + 8),
                            *(undefined1 (*) [16])(auStack_860 + uVar10 * 4));
        *(undefined1 (*) [16])(auStack_860 + uVar10 * 4) = auVar4;
        *(undefined1 (*) [16])(auStack_850 + uVar10 * 4) = auVar3;
        uVar10 = uVar10 + 8;
      } while (uVar10 < 0xf8);
      sVar9 = sVar9 + 1;
      pauVar6 = pauVar6 + 1;
    } while (sVar9 != threadIndex);
  }
  for (; uVar5 < ((threadIndex + 1) * sVar1) / threadCount; uVar5 = uVar5 + 1) {
    PVar2 = src[uVar5];
    uVar10 = ((ulong)PVar2 & 0xffffffff) >> ((byte)shift & 0x3f) & 0xff;
    uVar7 = local_880[uVar10];
    local_880[uVar10] = uVar7 + 1;
    dst[uVar7] = PVar2;
  }
  return;
}

Assistant:

void tbbRadixIteration1(const Key shift, 
                            const Ty* __restrict const src, 
                            Ty* __restrict const dst, 
                            const size_t threadIndex, const size_t threadCount)
    {
      const size_t startID = (threadIndex+0)*N/threadCount;
      const size_t endID   = (threadIndex+1)*N/threadCount;
      
      /* mask to extract some number of bits */
      const Key mask = BUCKETS-1;
      
      /* calculate total number of items for each bucket */
      __aligned(64) unsigned int total[BUCKETS];
      /*
      for (size_t i=0; i<BUCKETS; i++)
        total[i] = 0;
      */
      for (size_t i=0; i<BUCKETS; i+=VSIZEX)
        vintx::store(&total[i], zero);
      
      for (size_t i=0; i<threadCount; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          total[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&total[j], vintx::load(&total[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* calculate start offset of each bucket */
      __aligned(64) unsigned int offset[BUCKETS];
      offset[0] = 0;
      for (size_t i=1; i<BUCKETS; i++)    
        offset[i] = offset[i-1] + total[i-1];
      
      /* calculate start offset of each bucket for this thread */
      for (size_t i=0; i<threadIndex; i++)
      {
        /*
        for (size_t j=0; j<BUCKETS; j++)
          offset[j] += radixCount[i][j];
        */
        for (size_t j=0; j<BUCKETS; j+=VSIZEX)
          vintx::store(&offset[j], vintx::load(&offset[j]) + vintx::load(&radixCount[i][j]));
      }
      
      /* copy items into their buckets */
#if defined(__INTEL_COMPILER)
#pragma nounroll
#endif
      for (size_t i=startID; i<endID; i++) {
        const Ty elt = src[i];
#if defined(__64BIT__)
        const size_t index = ((size_t)(Key)src[i] >> (size_t)shift) & (size_t)mask;
#else
        const size_t index = ((Key)src[i] >> shift) & mask;
#endif
        dst[offset[index]++] = elt;
      }
    }